

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

void sort_tables(ecs_world_t *world,ecs_query_t *query)

{
  ecs_compare_action_t compare_00;
  ecs_entity_t entity;
  ecs_table_t *table_00;
  bool bVar1;
  int32_t iVar2;
  int32_t iVar3;
  void *pvVar4;
  int32_t *piVar5;
  bool bVar6;
  bool bVar7;
  int32_t local_64;
  int32_t index;
  int32_t *dirty_state;
  _Bool is_dirty;
  ecs_table_t *table;
  ecs_matched_table_t *table_data;
  _Bool tables_sorted;
  ecs_matched_table_t *tables;
  int32_t count;
  int32_t i;
  ecs_entity_t sort_on_component;
  ecs_compare_action_t compare;
  ecs_query_t *query_local;
  ecs_world_t *world_local;
  
  compare_00 = query->compare;
  if (compare_00 != (ecs_compare_action_t)0x0) {
    entity = query->sort_on_component;
    iVar2 = ecs_vector_count(query->tables);
    pvVar4 = _ecs_vector_first(query->tables,0x50,0x10);
    bVar1 = false;
    for (tables._4_4_ = 0; tables._4_4_ < iVar2; tables._4_4_ = tables._4_4_ + 1) {
      table_00 = *(ecs_table_t **)((long)pvVar4 + (long)tables._4_4_ * 0x50 + 8);
      bVar6 = *(long *)((long)pvVar4 + (long)tables._4_4_ * 0x50 + 0x40) == 0;
      if (bVar6) {
        piVar5 = ecs_table_get_monitor(table_00);
        *(int32_t **)((long)pvVar4 + (long)tables._4_4_ * 0x50 + 0x40) = piVar5;
      }
      piVar5 = ecs_table_get_dirty_state(table_00);
      bVar7 = true;
      if (!bVar6) {
        bVar7 = *piVar5 != **(int **)((long)pvVar4 + (long)tables._4_4_ * 0x50 + 0x40);
      }
      local_64 = -1;
      if (entity == 0) {
LAB_00125724:
        if (bVar7) {
          sort_table(world,table_00,local_64,compare_00);
          bVar1 = true;
        }
      }
      else {
        local_64 = ecs_type_index_of(table_00->type,entity);
        if (local_64 != -1) {
          iVar3 = ecs_vector_count(table_00->type);
          _ecs_assert(local_64 < iVar3,0xc,(char *)0x0,"index < ecs_vector_count(table->type)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x596);
          iVar3 = ecs_vector_count(table_00->type);
          if (iVar3 <= local_64) {
            __assert_fail("index < ecs_vector_count(table->type)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                          ,0x596,"void sort_tables(ecs_world_t *, ecs_query_t *)");
          }
          bVar6 = !bVar7;
          bVar7 = true;
          if (bVar6) {
            bVar7 = piVar5[local_64 + 1] !=
                    *(int *)(*(long *)((long)pvVar4 + (long)tables._4_4_ * 0x50 + 0x40) +
                            (long)(local_64 + 1) * 4);
          }
          goto LAB_00125724;
        }
      }
    }
    if ((bVar1) || (query->match_count != query->prev_match_count)) {
      build_sorted_tables(query);
      query->match_count = query->match_count + 1;
    }
  }
  return;
}

Assistant:

static
void sort_tables(
    ecs_world_t *world,
    ecs_query_t *query)
{
    ecs_compare_action_t compare = query->compare;
    if (!compare) {
        return;
    }
    
    ecs_entity_t sort_on_component = query->sort_on_component;

    /* Iterate over active tables. Don't bother with inactive tables, since
     * they're empty */
    int32_t i, count = ecs_vector_count(query->tables);
    ecs_matched_table_t *tables = ecs_vector_first(
        query->tables, ecs_matched_table_t);
    bool tables_sorted = false;

    for (i = 0; i < count; i ++) {
        ecs_matched_table_t *table_data = &tables[i];
        ecs_table_t *table = table_data->iter_data.table;

        /* If no monitor had been created for the table yet, create it now */
        bool is_dirty = false;
        if (!table_data->monitor) {
            table_data->monitor = ecs_table_get_monitor(table);

            /* A new table is always dirty */
            is_dirty = true;
        }

        int32_t *dirty_state = ecs_table_get_dirty_state(table);

        is_dirty = is_dirty || (dirty_state[0] != table_data->monitor[0]);

        int32_t index = -1;
        if (sort_on_component) {
            /* Get index of sorted component. We only care if the component we're
            * sorting on has changed or if entities have been added / re(moved) */
            index = ecs_type_index_of(table->type, sort_on_component);
            if (index != -1) {
                ecs_assert(index < ecs_vector_count(table->type), ECS_INTERNAL_ERROR, NULL); 
                is_dirty = is_dirty || (dirty_state[index + 1] != table_data->monitor[index + 1]);
            } else {
                /* Table does not contain component which means the sorted
                 * component is shared. Table does not need to be sorted */
                continue;
            }
        }      
        
        /* Check both if entities have moved (element 0) or if the component
         * we're sorting on has changed (index + 1) */
        if (is_dirty) {
            /* Sort the table */
            sort_table(world, table, index, compare);
            tables_sorted = true;
        }
    }

    if (tables_sorted || query->match_count != query->prev_match_count) {
        build_sorted_tables(query);
        query->match_count ++; /* Increase version if tables changed */
    }
}